

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::Data
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,
          Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *other)

{
  long lVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  Node<QString,_QMimeTypeXMLData> *pNVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  R_conflict29 RVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar10 = other->numBuckets;
  sVar11 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar11;
  this->spans = (Span *)0x0;
  RVar12 = allocateSpans(sVar10);
  this->spans = RVar12.spans;
  if (RVar12.nSpans != 0) {
    lVar9 = 0;
    sVar10 = 0;
    do {
      pSVar3 = other->spans;
      sVar11 = 0;
      do {
        bVar2 = pSVar3->offsets[sVar11 + lVar9];
        if ((ulong)bVar2 != 0xff) {
          pEVar4 = pSVar3[sVar10].entries;
          lVar1 = (ulong)bVar2 * 0x80 + (ulong)bVar2 * 8;
          pNVar8 = Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::insert
                             (this->spans + sVar10,sVar11);
          pDVar5 = *(Data **)((pEVar4->storage).data + lVar1);
          (pNVar8->key).d.d = pDVar5;
          (pNVar8->key).d.ptr = *(char16_t **)((pEVar4->storage).data + lVar1 + 8);
          (pNVar8->key).d.size = *(qsizetype *)((pEVar4->storage).data + lVar1 + 0x10);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type_conflict)
                  (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
            UNLOCK();
          }
          (pNVar8->value).hasGlobDeleteAll = (bool)(pEVar4->storage).data[lVar1 + 0x18];
          pDVar5 = *(Data **)((pEVar4->storage).data + lVar1 + 0x20);
          (pNVar8->value).name.d.d = pDVar5;
          (pNVar8->value).name.d.ptr = *(char16_t **)((pEVar4->storage).data + lVar1 + 0x28);
          (pNVar8->value).name.d.size = *(qsizetype *)((pEVar4->storage).data + lVar1 + 0x30);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar6 = *(Data **)((pEVar4->storage).data + lVar1 + 0x38);
          (pNVar8->value).localeComments.d = pDVar6;
          if ((pDVar6 != (Data *)0x0) &&
             ((pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar5 = *(Data **)((pEVar4->storage).data + lVar1 + 0x40);
          (pNVar8->value).genericIconName.d.d = pDVar5;
          (pNVar8->value).genericIconName.d.ptr =
               *(char16_t **)((pEVar4->storage).data + lVar1 + 0x48);
          (pNVar8->value).genericIconName.d.size =
               *(qsizetype *)((pEVar4->storage).data + lVar1 + 0x50);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar5 = *(Data **)((pEVar4->storage).data + lVar1 + 0x58);
          (pNVar8->value).iconName.d.d = pDVar5;
          (pNVar8->value).iconName.d.ptr = *(char16_t **)((pEVar4->storage).data + lVar1 + 0x60);
          (pNVar8->value).iconName.d.size = *(qsizetype *)((pEVar4->storage).data + lVar1 + 0x68);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar7 = *(Data **)((pEVar4->storage).data + lVar1 + 0x70);
          (pNVar8->value).globPatterns.d.d = pDVar7;
          (pNVar8->value).globPatterns.d.ptr = *(QString **)((pEVar4->storage).data + lVar1 + 0x78);
          (pNVar8->value).globPatterns.d.size =
               *(qsizetype *)((pEVar4->storage).data + lVar1 + 0x80);
          if (pDVar7 != (Data *)0x0) {
            LOCK();
            (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 != 0x80);
      sVar10 = sVar10 + 1;
      lVar9 = lVar9 + 0x90;
    } while (sVar10 != RVar12.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }